

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGB1555ToARGBRow_C(uint8 *src_argb1555,uint8 *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int local_20;
  uint8 a;
  uint8 r;
  uint8 g;
  uint8 b;
  int x;
  int width_local;
  uint8 *dst_argb_local;
  uint8 *src_argb1555_local;
  
  _x = dst_argb;
  dst_argb_local = src_argb1555;
  for (local_20 = 0; local_20 < width; local_20 = local_20 + 1) {
    bVar3 = (byte)((int)(uint)*dst_argb_local >> 5) | (dst_argb_local[1] & 3) << 3;
    bVar1 = dst_argb_local[1];
    bVar2 = dst_argb_local[1];
    *_x = (*dst_argb_local & 0x1f) << 3 | (byte)((int)(uint)(*dst_argb_local & 0x1f) >> 2);
    _x[1] = bVar3 << 3 | (byte)((int)(uint)bVar3 >> 2);
    _x[2] = (char)((int)(bVar1 & 0x7c) >> 2) << 3 | (byte)((int)(bVar1 & 0x7c) >> 4);
    _x[3] = -(char)((int)(uint)bVar2 >> 7);
    _x = _x + 4;
    dst_argb_local = dst_argb_local + 2;
  }
  return;
}

Assistant:

void ARGB1555ToARGBRow_C(const uint8* src_argb1555,
                         uint8* dst_argb,
                         int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8 b = src_argb1555[0] & 0x1f;
    uint8 g = (src_argb1555[0] >> 5) | ((src_argb1555[1] & 0x03) << 3);
    uint8 r = (src_argb1555[1] & 0x7c) >> 2;
    uint8 a = src_argb1555[1] >> 7;
    dst_argb[0] = (b << 3) | (b >> 2);
    dst_argb[1] = (g << 3) | (g >> 2);
    dst_argb[2] = (r << 3) | (r >> 2);
    dst_argb[3] = -a;
    dst_argb += 4;
    src_argb1555 += 2;
  }
}